

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall PDA::Transducer::Preprocessor::Preprocessor(Preprocessor *this,string *fileName)

{
  byte bVar1;
  bool bVar2;
  NotFoundException *this_00;
  allocator<wchar_t> local_281;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  wstring local_270;
  wstring local_250 [8];
  wstring line;
  wifstream inputFile;
  string *fileName_local;
  Preprocessor *this_local;
  
  std::__cxx11::wstring::wstring((wstring *)this);
  std::__cxx11::string::string((string *)&this->m_currentFileName);
  this->m_lineIndex = 0;
  std::__cxx11::string::operator=((string *)&this->m_currentFileName,(string *)fileName);
  std::wifstream::wifstream
            ((void *)((long)&line.field_2 + 8),(string *)&this->m_currentFileName,_S_in);
  bVar1 = std::wifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while (bVar2 = std::wios::operator_cast_to_bool
                             ((wios *)((long)&line.field_2 +
                                      *(long *)(line.field_2._8_8_ + -0x18) + 8)), bVar2) {
      std::__cxx11::wstring::wstring(local_250);
      std::getline<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
                ((wistream *)((long)&line.field_2 + 8),local_250);
      std::__cxx11::wstring::append((wstring *)this);
      std::__cxx11::wstring::append((wchar_t *)this);
      std::__cxx11::wstring::~wstring(local_250);
    }
    execute(this);
    std::wifstream::~wifstream((void *)((long)&line.field_2 + 8));
    return;
  }
  this_00 = (NotFoundException *)__cxa_allocate_exception(0x28);
  local_278._M_current = (char *)std::__cxx11::string::begin();
  local_280._M_current = (char *)std::__cxx11::string::end();
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::
  wstring<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((wstring *)&local_270,local_278,local_280,&local_281);
  Exception::NotFoundException::NotFoundException(this_00,&local_270);
  __cxa_throw(this_00,&Exception::NotFoundException::typeinfo,
              Exception::NotFoundException::~NotFoundException);
}

Assistant:

Preprocessor::Preprocessor(const std::string &fileName) : m_lineIndex(0)
{
    m_currentFileName = fileName;
    std::wifstream inputFile(m_currentFileName);
    if (inputFile.is_open())
    {
        while(inputFile)
        {
            std::wstring line;
            std::getline(inputFile, line);
            m_source.append(line);
            m_source.append(L"\r\n");
        }
    }
    else
    {
        throw PDA::Exception::NotFoundException(std::wstring(fileName.begin(), fileName.end()));
    }
    execute();
}